

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_raw_transaction_completed(lws *wsi)

{
  int iVar1;
  
  if (wsi->buflist_out == (lws_buflist *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    _lws_log(0x10,"%s: %p: deferring due to partial\n","lws_raw_transaction_completed",wsi);
    wsi->field_0x2e0 = wsi->field_0x2e0 | 0x10;
    lws_callback_on_writable(wsi);
  }
  return iVar1;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_raw_transaction_completed(struct lws *wsi)
{
	if (lws_has_buffered_out(wsi)) {
		/*
		 * ...so he tried to send something large, but it went out
		 * as a partial, but he immediately called us to say he wants
		 * to close the connection.
		 *
		 * Defer the close until the last part of the partial is sent.
		 *
		 */
		lwsl_debug("%s: %p: deferring due to partial\n", __func__, wsi);
		wsi->close_when_buffered_out_drained = 1;
		lws_callback_on_writable(wsi);

		return 0;
	}

	return -1;
}